

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Expression * __thiscall
wasm::Builder::replaceWithIdenticalType<wasm::RefFunc>(Builder *this,RefFunc *curr)

{
  Type *this_00;
  _Storage<wasm::Type,_true> _Var1;
  char cVar2;
  BasicHeapType BVar3;
  int iVar4;
  HeapType HVar5;
  Const *pCVar6;
  Block *pBVar7;
  _Storage<wasm::Type,_true> _Var8;
  Literal *this_01;
  RefNull *output;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  undefined1 local_d0 [8];
  Literal local_c8;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_b0 [24];
  uintptr_t uStack_98;
  array<unsigned_char,_16UL> bytes;
  Literal local_80;
  undefined1 auStack_68 [8];
  Literal value;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type;
  _Var1 = (_Storage<wasm::Type,_true>)
          (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id;
  _Var8 = _Var1;
  if (((ulong)_Var1 & 1) != 0 && 6 < (ulong)_Var1) {
    cVar2 = wasm::Type::isDefaultable();
    _Var8._M_value.id = (Type)this_00->id;
    if (cVar2 == '\0') goto LAB_0012d7a5;
    wasm::Literal::makeZeros((Type)local_d0);
    curr = (RefFunc *)makeConstantExpression(this,(Literals *)local_d0);
    if ((_Storage<wasm::Type,_true>)
        (((Block *)curr)->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.
        id != _Var1) {
      auStack_68 = (undefined1  [8])&local_48;
      value.field_0.i64 = 1;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)_Var1;
      local_48._0_8_ = curr;
      curr = (RefFunc *)
             makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this,(initializer_list<wasm::Expression_*> *)auStack_68,type);
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(local_b0);
    this_01 = &local_c8;
    goto LAB_0012d9ee;
  }
LAB_0012d7a5:
  if ((_Var8._0_4_ & 3) == 2 && 6 < (ulong)_Var8) {
    auStack_68 = (undefined1  [8])Type::getHeapType(this_00);
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = RefNullId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
    BVar3 = HeapType::getBottom((HeapType *)auStack_68);
    if (((uint)(0x7c < BVar3) * 4 + 3 & BVar3) != 0) {
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
    wasm::RefNull::finalize((Type)curr);
LAB_0012d89d:
    if ((_Storage<wasm::Type,_true>)
        (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id == _Var1
       ) {
      return (Expression *)curr;
    }
    auStack_68 = (undefined1  [8])&local_48;
    value.field_0.i64 = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)_Var1;
    local_48.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)curr;
    pBVar7 = makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                       (this,(initializer_list<wasm::Expression_*> *)auStack_68,type_00);
    return (Expression *)pBVar7;
  }
  if (((ulong)_Var8 & 1) == 0 && 6 < (ulong)_Var8) {
    HVar5 = Type::getHeapType(this_00);
    if (HVar5.id < 0x7d && ((uint)HVar5.id & 0x7b) == 0x30) {
      pCVar6 = makeConst<int>(this,0);
      uStack_98 = (uintptr_t)Type::getHeapType(this_00);
      iVar4 = wasm::HeapType::getShared();
      curr = (RefFunc *)MixedArena::allocSpace(&this->wasm->allocator,0x18,8);
      (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = RefI31Id;
      (curr->func).super_IString.str._M_len = (size_t)pCVar6;
      (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id =
           (ulong)(iVar4 == 0) * 4 + 0x30;
      wasm::RefI31::finalize();
      goto LAB_0012d89d;
    }
    _Var8._M_value.id = (Type)this_00->id;
  }
  auStack_68 = (undefined1  [8])0x0;
  value.field_0.i64 = 0;
  value.field_0.func.super_IString.str._M_str = (char *)0x0;
  switch(_Var8) {
  case (_Storage<wasm::Type,_true>)0x0:
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
    goto LAB_0012d9ea;
  case (_Storage<wasm::Type,_true>)0x1:
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = UnreachableId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 1;
    goto LAB_0012d9ea;
  case (_Storage<wasm::Type,_true>)0x2:
    local_48.func.super_IString.str._M_len =
         (ulong)(uint)local_48.func.super_IString.str._M_len._4_4_ << 0x20;
    local_38 = 2;
    wasm::Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x3:
    local_48.i64 = 0;
    local_38 = 3;
    wasm::Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x4:
    local_48.func.super_IString.str._M_len =
         (ulong)(uint)local_48.func.super_IString.str._M_len._4_4_ << 0x20;
    local_38 = 4;
    wasm::Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x5:
    local_48.i64 = 0;
    local_38 = 5;
    wasm::Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  case (_Storage<wasm::Type,_true>)0x6:
    uStack_98 = 0;
    bytes._M_elems[0] = '\0';
    bytes._M_elems[1] = '\0';
    bytes._M_elems[2] = '\0';
    bytes._M_elems[3] = '\0';
    bytes._M_elems[4] = '\0';
    bytes._M_elems[5] = '\0';
    bytes._M_elems[6] = '\0';
    bytes._M_elems[7] = '\0';
    wasm::Literal::Literal((Literal *)&local_48.func,(uchar *)&uStack_98);
    wasm::Literal::operator=((Literal *)auStack_68,(Literal *)&local_48.func);
    break;
  default:
    goto switchD_0012d902_default;
  }
  wasm::Literal::~Literal((Literal *)&local_48.func);
  wasm::Literal::Literal(&local_80,(Literal *)auStack_68);
  curr = (RefFunc *)makeConst(this,&local_80);
  wasm::Literal::~Literal(&local_80);
LAB_0012d9ea:
  this_01 = (Literal *)auStack_68;
LAB_0012d9ee:
  wasm::Literal::~Literal(this_01);
switchD_0012d902_default:
  return (Expression *)(Block *)curr;
}

Assistant:

Expression* replaceWithIdenticalType(T* curr) {
    auto type = curr->type;
    // Anything that would otherwise have a more refined type than the original
    // expression needs to be wrapped in a block with the original type.
    auto maybeWrap = [&](Expression* expr) -> Expression* {
      return expr->type == type ? expr : makeBlock({expr}, type);
    };
    if (curr->type.isTuple() && curr->type.isDefaultable()) {
      return maybeWrap(makeConstantExpression(Literal::makeZeros(curr->type)));
    }
    if (curr->type.isNullable()) {
      return maybeWrap(
        ExpressionManipulator::refNull(curr, curr->type.getHeapType()));
    }
    if (curr->type.isRef() &&
        curr->type.getHeapType().isMaybeShared(HeapType::i31)) {
      return maybeWrap(
        makeRefI31(makeConst(0), curr->type.getHeapType().getShared()));
    }
    if (!curr->type.isBasic()) {
      // We can't do any better, keep the original.
      return curr;
    }
    Literal value;
    // TODO: reuse node conditionally when possible for literals
    switch (curr->type.getBasic()) {
      case Type::i32:
        value = Literal(int32_t(0));
        break;
      case Type::i64:
        value = Literal(int64_t(0));
        break;
      case Type::f32:
        value = Literal(float(0));
        break;
      case Type::f64:
        value = Literal(double(0));
        break;
      case Type::v128: {
        std::array<uint8_t, 16> bytes;
        bytes.fill(0);
        value = Literal(bytes.data());
        break;
      }
      case Type::none:
        return ExpressionManipulator::nop(curr);
      case Type::unreachable:
        return ExpressionManipulator::unreachable(curr);
    }
    return makeConst(value);
  }